

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<bloaty::Regex>
          (ParseContext *this,Regex *msg,char *ptr)

{
  int iVar1;
  bool bVar2;
  uint32 limit;
  int delta;
  char *local_28;
  
  local_28 = ptr;
  limit = ReadSize(&local_28);
  if (local_28 != (char *)0x0) {
    delta = EpsCopyInputStream::PushLimit(&this->super_EpsCopyInputStream,local_28,limit);
    iVar1 = this->depth_;
    this->depth_ = iVar1 + -1;
    if ((0 < iVar1) &&
       (local_28 = bloaty::Regex::_InternalParse(msg,local_28,this), local_28 != (char *)0x0)) {
      this->depth_ = this->depth_ + 1;
      bVar2 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,delta);
      if (bVar2) {
        return local_28;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}